

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O2

char * alignof_type(char *type,size_t *align)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  byte **type_00;
  bool bVar4;
  ulong uStack_40;
  char *t;
  size_t *align_local;
  byte *local_20;
  
  align_local = align;
  pcVar2 = objc_skip_type_qualifiers(type);
  cVar1 = *pcVar2;
  t = pcVar2;
  switch(cVar1) {
  case '^':
    uVar3 = 0x40;
    if (0x40 < *align) {
      uVar3 = *align;
    }
    *align = uVar3;
    t = (char *)0x0;
    pcVar2 = alignof_type(pcVar2 + 1,(size_t *)&t);
    return pcVar2;
  case '_':
  case '`':
  case 'a':
  case 'e':
  case 'g':
  case 'h':
  case 'k':
  case 'm':
  case 'n':
  case 'o':
  case 'p':
  case 'r':
  case 't':
  case 'u':
  case 'w':
  case 'x':
  case 'y':
  case 'z':
switchD_00111dd6_caseD_41:
    abort();
  case 'b':
    local_20 = (byte *)(pcVar2 + 1);
    type_00 = &local_20;
    strtol((char *)local_20,(char **)type_00,10);
    local_20 = (byte *)alignof_type((char *)local_20,align);
    strtol((char *)local_20,(char **)type_00,10);
    goto LAB_00111f5c;
  case 'c':
switchD_00111dd6_caseD_42:
    uVar3 = *align;
    bVar4 = uVar3 < 9;
    uStack_40 = 8;
    break;
  case 'd':
  case 'l':
  case 'q':
    goto switchD_00111dd6_caseD_4c;
  case 'f':
  case 'i':
switchD_00111dd6_caseD_49:
    uVar3 = *align;
    bVar4 = uVar3 < 0x21;
    uStack_40 = 0x20;
    break;
  case 'j':
    t = pcVar2 + 1;
    cVar1 = pcVar2[1];
    switch(cVar1) {
    case 'c':
switchD_00111ee3_caseD_63:
      uVar3 = *align;
      bVar4 = uVar3 < 9;
      uStack_40 = 8;
      goto LAB_00111fb5;
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'r':
      goto switchD_00111ee3_caseD_65;
    case 'f':
    case 'i':
switchD_00111ee3_caseD_66:
      uVar3 = *align;
      bVar4 = uVar3 < 0x21;
      uStack_40 = 0x20;
      goto LAB_00111fb5;
    case 's':
switchD_00111ee3_caseD_73:
      uVar3 = *align;
      bVar4 = uVar3 < 0x11;
      uStack_40 = 0x10;
      goto LAB_00111fb5;
    default:
      switch(cVar1) {
      case 'C':
        goto switchD_00111ee3_caseD_63;
      case 'D':
        uVar3 = *align;
        bVar4 = uVar3 < 0x81;
        uStack_40 = 0x80;
        goto LAB_00111fb5;
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'J':
      case 'K':
        goto switchD_00111ee3_caseD_65;
      case 'I':
        goto switchD_00111ee3_caseD_66;
      case 'L':
        break;
      default:
        if (cVar1 != 'Q') {
          if (cVar1 == 'S') goto switchD_00111ee3_caseD_73;
          goto switchD_00111ee3_caseD_65;
        }
      }
    case 'd':
    case 'l':
    case 'q':
      uVar3 = *align;
      bVar4 = uVar3 < 0x41;
      uStack_40 = 0x40;
LAB_00111fb5:
      if (!bVar4) {
        uStack_40 = uVar3;
      }
      *align = uStack_40;
      return pcVar2 + 2;
    }
  case 's':
switchD_00111dd6_caseD_53:
    uVar3 = *align;
    bVar4 = uVar3 < 0x11;
    uStack_40 = 0x10;
    break;
  case 'v':
    goto switchD_00111dd6_caseD_3f;
  case '{':
switchD_00111ee3_caseD_65:
    type_00 = (byte **)&t;
    parse_struct((char **)type_00,alignof_type,align);
LAB_00111f5c:
    return (char *)*type_00;
  default:
    switch(cVar1) {
    case '?':
      goto switchD_00111dd6_caseD_3f;
    case '@':
      uVar3 = 0x40;
      if (0x40 < *align) {
        uVar3 = *align;
      }
      *align = uVar3;
      pcVar2 = skip_object_extended_qualifiers(pcVar2);
      goto switchD_00111dd6_caseD_3f;
    case 'A':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'J':
    case 'K':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'R':
      goto switchD_00111dd6_caseD_41;
    case 'B':
    case 'C':
      goto switchD_00111dd6_caseD_42;
    case 'D':
      uVar3 = *align;
      bVar4 = uVar3 < 0x81;
      uStack_40 = 0x80;
      break;
    case 'I':
      goto switchD_00111dd6_caseD_49;
    case 'S':
      goto switchD_00111dd6_caseD_53;
    default:
      if (cVar1 != '#') {
        if (cVar1 == '(') {
          type_00 = (byte **)&t;
          parse_union((char **)type_00,alignof_type,align);
          goto LAB_00111f5c;
        }
        if ((cVar1 != '*') && (cVar1 != ':')) {
          if (cVar1 == '[') {
            parse_array(&t,alignof_type,&align_local);
            return t;
          }
          goto switchD_00111dd6_caseD_41;
        }
      }
    case 'L':
    case 'Q':
switchD_00111dd6_caseD_4c:
      uVar3 = *align;
      bVar4 = uVar3 < 0x41;
      uStack_40 = 0x40;
    }
  }
  if (!bVar4) {
    uStack_40 = uVar3;
  }
  *align = uStack_40;
switchD_00111dd6_caseD_3f:
  return pcVar2 + 1;
}

Assistant:

static const char *alignof_type(const char *type, size_t *align)
{
	type = objc_skip_type_qualifiers(type);
	switch (*type)
	{
		// For all primitive types, we return the maximum of the new alignment
		// and the old one
#define APPLY_TYPE(typeName, name, capitalizedName, encodingChar) \
		case encodingChar:\
		{\
			*align = max((alignof(typeName) * 8), *align);\
			return type + 1;\
		}
#define NON_INTEGER_TYPES 1
#define SKIP_ID 1
#include "type_encoding_cases.h"
		case '@':
		{
			*align = max((alignof(id) * 8), *align);\
			return skip_object_extended_qualifiers(type) + 1;
		}
		case '?':
		case 'v': return type+1;
		case 'j':
		{
			type++;
			switch (*type)
			{
#define APPLY_TYPE(typeName, name, capitalizedName, encodingChar) \
		case encodingChar:\
		{\
			*align = max((alignof(_Complex typeName) * 8), *align);\
			return type + 1;\
		}
#include "type_encoding_cases.h"
			}
		}
		case '{':
		{
			const char *t = type;
			parse_struct(&t, (type_parser)alignof_type, align);
			return t;
		}
		case '(':
		{
			const char *t = type;
			parse_union(&t, (type_parser)alignof_type, align);
			return t;
		}
		case '[':
		{
			const char *t = type;
			parse_array(&t, (type_parser)alignof_type, &align);
			return t;
		}
		case 'b':
		{
			// Consume the b
			type++;
			// Ignore the offset
			strtol(type, (char**)&type, 10);
			// Alignment of a bitfield is the alignment of the type that
			// contains it
			type = alignof_type(type, align);
			// Ignore the number of bits
			strtol(type, (char**)&type, 10);
			return type;
		}
		case '^':
		{
			*align = max((alignof(void*) * 8), *align);
			// All pointers look the same to me.
			size_t ignored = 0;
			// Skip the definition of the pointeee type.
			return alignof_type(type+1, &ignored);
		}
	}
	abort();
	return NULL;
}